

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# algorithm.hh
# Opt level: O2

void __thiscall
tchecker::algorithms::couvscc::
single_algorithm_t<tchecker::zg::zg_t,_tchecker::tck_liveness::zg_couvscc::graph_t>::push
          (single_algorithm_t<tchecker::zg::zg_t,_tchecker::tck_liveness::zg_couvscc::graph_t> *this
          ,node_sptr_t *n,zg_t *ts,graph_t *graph,
          dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *labels,stats_t *stats)

{
  node_t *pnVar1;
  uint *puVar2;
  bool *pbVar3;
  unsigned_long *puVar4;
  uint uVar5;
  todo_stack_entry_t local_88;
  
  uVar5 = this->_count + 1;
  this->_count = uVar5;
  pnVar1 = (node_t *)
           intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_couvscc::node_t,_tchecker::tck_liveness::zg_couvscc::edge_t>,_unsigned_long,_1UL>_>
           ::operator->(n);
  puVar2 = couvscc::node_t::dfsnum(pnVar1);
  *puVar2 = uVar5;
  pnVar1 = (node_t *)
           intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_couvscc::node_t,_tchecker::tck_liveness::zg_couvscc::edge_t>,_unsigned_long,_1UL>_>
           ::operator->(n);
  pbVar3 = couvscc::node_t::current(pnVar1);
  *pbVar3 = true;
  intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_couvscc::node_t,_tchecker::tck_liveness::zg_couvscc::edge_t>,_unsigned_long,_1UL>_>
  ::intrusive_shared_ptr_t(&local_88.n,n);
  expand_node(&local_88.succ,this,n,ts,graph,labels,stats);
  std::
  deque<tchecker::algorithms::couvscc::single_algorithm_t<tchecker::zg::zg_t,tchecker::tck_liveness::zg_couvscc::graph_t>::todo_stack_entry_t,std::allocator<tchecker::algorithms::couvscc::single_algorithm_t<tchecker::zg::zg_t,tchecker::tck_liveness::zg_couvscc::graph_t>::todo_stack_entry_t>>
  ::
  emplace_back<tchecker::algorithms::couvscc::single_algorithm_t<tchecker::zg::zg_t,tchecker::tck_liveness::zg_couvscc::graph_t>::todo_stack_entry_t>
            ((deque<tchecker::algorithms::couvscc::single_algorithm_t<tchecker::zg::zg_t,tchecker::tck_liveness::zg_couvscc::graph_t>::todo_stack_entry_t,std::allocator<tchecker::algorithms::couvscc::single_algorithm_t<tchecker::zg::zg_t,tchecker::tck_liveness::zg_couvscc::graph_t>::todo_stack_entry_t>>
              *)&this->_todo,&local_88);
  todo_stack_entry_t::~todo_stack_entry_t(&local_88);
  intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_couvscc::node_t,_tchecker::tck_liveness::zg_couvscc::edge_t>,_unsigned_long,_1UL>_>
  ::intrusive_shared_ptr_t(&local_88.n,n);
  std::
  deque<tchecker::algorithms::couvscc::single_algorithm_t<tchecker::zg::zg_t,tchecker::tck_liveness::zg_couvscc::graph_t>::roots_stack_entry_t,std::allocator<tchecker::algorithms::couvscc::single_algorithm_t<tchecker::zg::zg_t,tchecker::tck_liveness::zg_couvscc::graph_t>::roots_stack_entry_t>>
  ::
  emplace_back<tchecker::algorithms::couvscc::single_algorithm_t<tchecker::zg::zg_t,tchecker::tck_liveness::zg_couvscc::graph_t>::roots_stack_entry_t>
            ((deque<tchecker::algorithms::couvscc::single_algorithm_t<tchecker::zg::zg_t,tchecker::tck_liveness::zg_couvscc::graph_t>::roots_stack_entry_t,std::allocator<tchecker::algorithms::couvscc::single_algorithm_t<tchecker::zg::zg_t,tchecker::tck_liveness::zg_couvscc::graph_t>::roots_stack_entry_t>>
              *)&this->_roots,(roots_stack_entry_t *)&local_88);
  intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_couvscc::node_t,_tchecker::tck_liveness::zg_couvscc::edge_t>,_unsigned_long,_1UL>_>
  ::~intrusive_shared_ptr_t(&local_88.n);
  std::
  deque<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_couvscc::node_t,_tchecker::tck_liveness::zg_couvscc::edge_t>,_unsigned_long,_1UL>_>,_std::allocator<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_couvscc::node_t,_tchecker::tck_liveness::zg_couvscc::edge_t>,_unsigned_long,_1UL>_>_>_>
  ::push_back(&(this->_active).c,n);
  puVar4 = stats_t::visited_states(stats);
  *puVar4 = *puVar4 + 1;
  return;
}

Assistant:

void push(node_sptr_t & n, TS & ts, GRAPH & graph, boost::dynamic_bitset<> const & labels,
            tchecker::algorithms::couvscc::stats_t & stats)
  {
    ++_count;
    n->dfsnum() = _count;
    n->current() = true;
    _todo.push(todo_stack_entry_t{n, expand_node(n, ts, graph, labels, stats)});
    _roots.push(roots_stack_entry_t{n});
    _active.push(n);
    ++stats.visited_states();
  }